

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_mixer.cpp
# Opt level: O3

void __thiscall
MixerContext::MixerContext
          (MixerContext *this,cubeb_sample_format f,uint32_t in_channels,cubeb_channel_layout in,
          uint32_t out_channels,cubeb_channel_layout out)

{
  cubeb_channel_layout cVar1;
  int iVar2;
  uint uVar3;
  EVP_PKEY_CTX *ctx;
  
  this->_format = f;
  cVar1 = in;
  if (in == 0) {
    if (in_channels == 1) {
      cVar1 = 4;
    }
    else if (in_channels == 2) {
      cVar1 = 3;
    }
  }
  this->_in_ch_layout = cVar1;
  cVar1 = out;
  if (out == 0) {
    if (out_channels == 1) {
      cVar1 = 4;
    }
    else if (out_channels == 2) {
      cVar1 = 3;
    }
  }
  this->_out_ch_layout = cVar1;
  this->_in_ch_count = in_channels;
  this->_out_ch_count = out_channels;
  this->_surround_mix_level = 0.70710677;
  this->_center_mix_level = 0.70710677;
  this->_lfe_mix_level = 1.0;
  uVar3 = in - (in >> 1 & 0x55555555);
  uVar3 = (uVar3 >> 2 & 0x33333333) + (uVar3 & 0x33333333);
  ctx = (EVP_PKEY_CTX *)0x0;
  memset(this->_matrix,0,0x4422);
  if ((((uVar3 >> 4) + uVar3 & 0xf0f0f0f) * 0x1010101 >> 0x18 == in_channels) &&
     (uVar3 = out - (out >> 1 & 0x55555555),
     uVar3 = (uVar3 >> 2 & 0x33333333) + (uVar3 & 0x33333333),
     ((uVar3 >> 4) + uVar3 & 0xf0f0f0f) * 0x1010101 >> 0x18 == out_channels)) {
    iVar2 = init(this,ctx);
    this->_valid = -1 < iVar2;
  }
  return;
}

Assistant:

MixerContext(cubeb_sample_format f, uint32_t in_channels,
               cubeb_channel_layout in, uint32_t out_channels,
               cubeb_channel_layout out)
      : _format(f), _in_ch_layout(cubeb_channel_layout_check(in, in_channels)),
        _out_ch_layout(cubeb_channel_layout_check(out, out_channels)),
        _in_ch_count(in_channels), _out_ch_count(out_channels)
  {
    if (in_channels != cubeb_channel_layout_nb_channels(in) ||
        out_channels != cubeb_channel_layout_nb_channels(out)) {
      // Mismatch between channels and layout, aborting.
      return;
    }
    _valid = init() >= 0;
  }